

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,SourceBuffer *args)

{
  iterator pSVar1;
  size_t *in_RSI;
  SmallVectorBase<slang::SourceBuffer> *in_RDI;
  SourceBuffer *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::SourceBuffer> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::SourceBuffer_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pSVar1 = end(in_RDI);
    (pSVar1->data)._M_len = *in_RSI;
    (pSVar1->data)._M_str = (char *)in_RSI[1];
    pSVar1->library = (SourceLibrary *)in_RSI[2];
    *(size_t *)&pSVar1->id = in_RSI[3];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }